

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_flat_block_finder_run
              (aom_flat_block_finder_t *block_finder,uint8_t *data,int w,int h,int stride,
              uint8_t *flat_blocks)

{
  size_t size;
  int iVar1;
  uint uVar2;
  double *plane;
  double *block;
  void *memblk;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  int bx;
  ulong uVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  
  iVar1 = block_finder->block_size;
  lVar10 = (long)iVar1;
  uVar15 = iVar1 * iVar1;
  uVar4 = (long)(iVar1 + w + -1) / (long)iVar1;
  uVar5 = (long)(iVar1 + h + -1) / (long)iVar1;
  uVar9 = uVar5 & 0xffffffff;
  size = (ulong)uVar15 * 8;
  plane = (double *)aom_malloc(size);
  block = (double *)aom_malloc(size);
  iVar13 = (int)uVar4;
  iVar16 = (int)uVar5;
  uVar2 = iVar16 * iVar13;
  memblk = aom_malloc((long)(int)uVar2 * 8);
  if (((plane == (double *)0x0) || (block == (double *)0x0)) || (memblk == (void *)0x0)) {
    fprintf(_stderr,"Failed to allocate memory for block of size %d\n",(ulong)uVar15);
    aom_free(plane);
    aom_free(block);
    aom_free(memblk);
    iVar16 = -1;
  }
  else {
    dVar19 = (double)((iVar1 + -2) * (iVar1 + -2));
    uVar5 = 0;
    if (0 < iVar13) {
      uVar5 = uVar4 & 0xffffffff;
    }
    if (iVar16 < 1) {
      uVar9 = 0;
    }
    iVar16 = 0;
    for (uVar4 = 0; uVar4 != uVar9; uVar4 = uVar4 + 1) {
      for (uVar17 = 0; uVar17 != uVar5; uVar17 = uVar17 + 1) {
        aom_flat_block_finder_extract_block
                  (block_finder,data,w,h,stride,iVar1 * (int)uVar17,(int)uVar4 * iVar1,plane,block);
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar29 = 0.0;
        dVar20 = 0.0;
        dVar21 = 0.0;
        pdVar3 = block;
        pdVar8 = block + lVar10 * 2;
        pdVar6 = block;
        for (uVar11 = 1; pdVar6 = pdVar6 + lVar10, uVar12 = 1,
            (long)uVar11 < (long)(int)(iVar1 - 1U); uVar11 = uVar11 + 1) {
          for (; iVar1 - 1U != uVar12; uVar12 = uVar12 + 1) {
            dVar26 = pdVar6[uVar12];
            dVar22 = (pdVar6[uVar12 + 1] - pdVar6[uVar12 - 1]) * 0.5;
            dVar25 = (pdVar8[uVar12] - pdVar3[uVar12]) * 0.5;
            dVar29 = dVar29 + dVar26;
            dVar20 = dVar20 + dVar22 * dVar22;
            dVar21 = dVar21 + dVar22 * dVar25;
            dVar27 = dVar27 + dVar26 * dVar26;
            dVar28 = dVar28 + dVar25 * dVar25;
          }
          pdVar8 = pdVar8 + lVar10;
          pdVar3 = pdVar3 + lVar10;
        }
        auVar23._8_8_ = dVar20;
        auVar23._0_8_ = dVar28;
        auVar24._8_8_ = dVar19;
        auVar24._0_8_ = dVar19;
        auVar24 = divpd(auVar23,auVar24);
        dVar26 = auVar24._0_8_ + auVar24._8_8_;
        dVar28 = dVar26 * dVar26 +
                 (auVar24._8_8_ * auVar24._0_8_ - (dVar21 / dVar19) * (dVar21 / dVar19)) * -4.0;
        dVar21 = SQRT(dVar28);
        dVar20 = dVar21;
        if (dVar28 < 0.0) {
          dVar20 = sqrt(dVar28);
        }
        dVar27 = dVar27 / dVar19 - (dVar29 / dVar19) * (dVar29 / dVar19);
        dVar20 = (dVar20 + dVar26) * 0.5;
        if (dVar28 < 0.0) {
          dVar21 = sqrt(dVar28);
        }
        dVar21 = (dVar26 - dVar21) * 0.5;
        if (dVar21 <= 1e-06) {
          dVar21 = 1e-06;
        }
        dVar28 = dVar20 * -12434.0 +
                 dVar26 * 13087.0 + dVar27 * -6682.0 + (dVar20 / dVar21) * -0.2056 + 2.5694;
        dVar28 = exp((double)(-(ulong)(dVar28 < -25.0) & 0x4039000000000000 |
                             ~-(ulong)(dVar28 < -25.0) &
                             (-(ulong)(100.0 < dVar28) & 0xc059000000000000 |
                             ~-(ulong)(100.0 < dVar28) & (ulong)-dVar28)));
        if (0.005 / (double)(int)uVar15 < dVar27) {
          fVar18 = (float)(1.0 / (dVar28 + 1.0));
        }
        else {
          fVar18 = 0.0;
        }
        bVar14 = dVar26 < 0.000146484375 & -(dVar20 / dVar21 < 1.25) & -(dVar20 < 7.8125e-05) &
                 0.005 / (double)(int)uVar15 < dVar27;
        iVar16 = iVar16 + (uint)bVar14;
        lVar7 = uVar4 * (long)iVar13 + uVar17;
        flat_blocks[lVar7] = -bVar14;
        *(float *)((long)memblk + lVar7 * 8 + 4) = fVar18;
        *(int *)((long)memblk + lVar7 * 8) = (int)lVar7;
      }
    }
    qsort(memblk,(long)(int)uVar2,8,compare_scores);
    fVar18 = *(float *)((long)memblk + (long)((int)(uVar2 * 0x5a) / 100) * 8 + 4);
    uVar5 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      if (fVar18 <= *(float *)((long)memblk + uVar5 * 8 + 4)) {
        iVar1 = *(int *)((long)memblk + uVar5 * 8);
        iVar16 = iVar16 + (uint)(flat_blocks[iVar1] == 0);
        flat_blocks[iVar1] = flat_blocks[iVar1] | 1;
      }
    }
    aom_free(block);
    aom_free(plane);
    aom_free(memblk);
  }
  return iVar16;
}

Assistant:

int aom_flat_block_finder_run(const aom_flat_block_finder_t *block_finder,
                              const uint8_t *const data, int w, int h,
                              int stride, uint8_t *flat_blocks) {
  // The gradient-based features used in this code are based on:
  //  A. Kokaram, D. Kelly, H. Denman and A. Crawford, "Measuring noise
  //  correlation for improved video denoising," 2012 19th, ICIP.
  // The thresholds are more lenient to allow for correct grain modeling
  // if extreme cases.
  const int block_size = block_finder->block_size;
  const int n = block_size * block_size;
  const double kTraceThreshold = 0.15 / (32 * 32);
  const double kRatioThreshold = 1.25;
  const double kNormThreshold = 0.08 / (32 * 32);
  const double kVarThreshold = 0.005 / (double)n;
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  int num_flat = 0;
  double *plane = (double *)aom_malloc(n * sizeof(*plane));
  double *block = (double *)aom_malloc(n * sizeof(*block));
  index_and_score_t *scores = (index_and_score_t *)aom_malloc(
      num_blocks_w * num_blocks_h * sizeof(*scores));
  if (plane == NULL || block == NULL || scores == NULL) {
    fprintf(stderr, "Failed to allocate memory for block of size %d\n", n);
    aom_free(plane);
    aom_free(block);
    aom_free(scores);
    return -1;
  }

#ifdef NOISE_MODEL_LOG_SCORE
  fprintf(stderr, "score = [");
#endif
  for (int by = 0; by < num_blocks_h; ++by) {
    for (int bx = 0; bx < num_blocks_w; ++bx) {
      // Compute gradient covariance matrix.
      aom_flat_block_finder_extract_block(block_finder, data, w, h, stride,
                                          bx * block_size, by * block_size,
                                          plane, block);
      double Gxx = 0, Gxy = 0, Gyy = 0;
      double mean = 0;
      double var = 0;

      for (int yi = 1; yi < block_size - 1; ++yi) {
        for (int xi = 1; xi < block_size - 1; ++xi) {
          const double gx = (block[yi * block_size + xi + 1] -
                             block[yi * block_size + xi - 1]) /
                            2;
          const double gy = (block[yi * block_size + xi + block_size] -
                             block[yi * block_size + xi - block_size]) /
                            2;
          Gxx += gx * gx;
          Gxy += gx * gy;
          Gyy += gy * gy;

          const double value = block[yi * block_size + xi];
          mean += value;
          var += value * value;
        }
      }
      mean /= (block_size - 2) * (block_size - 2);

      // Normalize gradients by block_size.
      Gxx /= ((block_size - 2) * (block_size - 2));
      Gxy /= ((block_size - 2) * (block_size - 2));
      Gyy /= ((block_size - 2) * (block_size - 2));
      var = var / ((block_size - 2) * (block_size - 2)) - mean * mean;

      {
        const double trace = Gxx + Gyy;
        const double det = Gxx * Gyy - Gxy * Gxy;
        const double e1 = (trace + sqrt(trace * trace - 4 * det)) / 2.;
        const double e2 = (trace - sqrt(trace * trace - 4 * det)) / 2.;
        const double norm = e1;  // Spectral norm
        const double ratio = (e1 / AOMMAX(e2, 1e-6));
        const int is_flat = (trace < kTraceThreshold) &&
                            (ratio < kRatioThreshold) &&
                            (norm < kNormThreshold) && (var > kVarThreshold);
        // The following weights are used to combine the above features to give
        // a sigmoid score for flatness. If the input was normalized to [0,100]
        // the magnitude of these values would be close to 1 (e.g., weights
        // corresponding to variance would be a factor of 10000x smaller).
        // The weights are given in the following order:
        //    [{var}, {ratio}, {trace}, {norm}, offset]
        // with one of the most discriminative being simply the variance.
        const double weights[5] = { -6682, -0.2056, 13087, -12434, 2.5694 };
        double sum_weights = weights[0] * var + weights[1] * ratio +
                             weights[2] * trace + weights[3] * norm +
                             weights[4];
        // clamp the value to [-25.0, 100.0] to prevent overflow
        sum_weights = fclamp(sum_weights, -25.0, 100.0);
        const float score = (float)(1.0 / (1 + exp(-sum_weights)));
        flat_blocks[by * num_blocks_w + bx] = is_flat ? 255 : 0;
        scores[by * num_blocks_w + bx].score = var > kVarThreshold ? score : 0;
        scores[by * num_blocks_w + bx].index = by * num_blocks_w + bx;
#ifdef NOISE_MODEL_LOG_SCORE
        fprintf(stderr, "%g %g %g %g %g %d ", score, var, ratio, trace, norm,
                is_flat);
#endif
        num_flat += is_flat;
      }
    }
#ifdef NOISE_MODEL_LOG_SCORE
    fprintf(stderr, "\n");
#endif
  }
#ifdef NOISE_MODEL_LOG_SCORE
  fprintf(stderr, "];\n");
#endif
  // Find the top-scored blocks (most likely to be flat) and set the flat blocks
  // be the union of the thresholded results and the top 10th percentile of the
  // scored results.
  qsort(scores, num_blocks_w * num_blocks_h, sizeof(*scores), &compare_scores);
  const int top_nth_percentile = num_blocks_w * num_blocks_h * 90 / 100;
  const float score_threshold = scores[top_nth_percentile].score;
  for (int i = 0; i < num_blocks_w * num_blocks_h; ++i) {
    if (scores[i].score >= score_threshold) {
      num_flat += flat_blocks[scores[i].index] == 0;
      flat_blocks[scores[i].index] |= 1;
    }
  }
  aom_free(block);
  aom_free(plane);
  aom_free(scores);
  return num_flat;
}